

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::PizCompressor::uncompress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  char *pcVar2;
  size_t __n;
  unsigned_short *puVar3;
  int iVar4;
  int iVar5;
  const_iterator cVar6;
  ConstIterator CVar7;
  InputExc *pIVar8;
  PizCompressor *pPVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  int i_2;
  ChannelData *pCVar15;
  long lVar16;
  int j;
  long lVar17;
  char *inPtr_local;
  PizCompressor *local_88;
  int local_7c;
  int local_78;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  unsigned_short *local_70;
  char *outEnd;
  AutoArray<unsigned_short,_65536> lut;
  AutoArray<unsigned_char,_8192> bitmap;
  int length;
  char **local_40;
  char *local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  local_38 = inPtr + inSize;
  local_88 = (PizCompressor *)CONCAT44(local_88._4_4_,(range->min).x);
  local_78 = (range->min).y;
  iVar4 = (range->max).x;
  iVar10 = (range->max).y;
  local_7c = this->_maxY;
  if (iVar10 < this->_maxY) {
    local_7c = iVar10;
  }
  iVar10 = this->_maxX;
  if (iVar4 < this->_maxX) {
    iVar10 = iVar4;
  }
  local_70 = this->_tmpBuffer;
  inPtr_local = inPtr;
  local_40 = outPtr;
  cVar6._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
  lVar13 = 0x1c;
  while (CVar7 = ChannelList::end(this->_channels), puVar3 = local_70,
        (const_iterator)cVar6._M_node != CVar7._i._M_node) {
    pCVar15 = this->_channelData;
    *(unsigned_short **)((long)pCVar15 + lVar13 + -0x1c) = local_70;
    *(unsigned_short **)((long)pCVar15 + lVar13 + -0x14) = local_70;
    iVar4 = numSamples(*(int *)&cVar6._M_node[9].field_0x4,(int)local_88,iVar10);
    *(int *)((long)pCVar15 + lVar13 + -0xc) = iVar4;
    iVar4 = numSamples(*(int *)&cVar6._M_node[9]._M_parent,local_78,local_7c);
    *(int *)((long)pCVar15 + lVar13 + -8) = iVar4;
    *(undefined4 *)((long)pCVar15 + lVar13 + -4) = *(undefined4 *)&cVar6._M_node[9]._M_parent;
    iVar4 = pixelTypeSize(cVar6._M_node[9]._M_color);
    iVar5 = pixelTypeSize(HALF);
    *(int *)((long)&pCVar15->start + lVar13) = iVar4 / iVar5;
    local_70 = puVar3 + (iVar4 / iVar5) * *(int *)((long)pCVar15 + lVar13 + -0xc) *
                        *(int *)((long)pCVar15 + lVar13 + -8);
    cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
    lVar13 = lVar13 + 0x20;
  }
  local_88 = this;
  AutoArray<unsigned_char,_8192>::AutoArray(&bitmap);
  memset(bitmap._data,0,0x2000);
  pcVar14 = local_38;
  if (local_38 < inPtr_local + 4) {
    pcVar14 = "PIZ compressed data too short";
  }
  else {
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&inPtr_local,&minNonZero);
    iVar4 = local_78;
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&inPtr_local,&maxNonZero);
    if (maxNonZero < 0x2000) {
      if (minNonZero <= maxNonZero) {
        iVar10 = (uint)maxNonZero - (uint)minNonZero;
        if (pcVar14 < inPtr_local + (long)iVar10 + 1) {
          pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar8,"PIZ compressed data too short");
          __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        CharPtrIO::readChars(&inPtr_local,(char *)(bitmap._data + (uint)minNonZero),iVar10 + 1);
      }
      AutoArray<unsigned_short,_65536>::AutoArray(&lut);
      uVar12 = 0;
      iVar10 = 0;
      do {
        uVar11 = (uint)uVar12;
        if (uVar11 == 0) {
LAB_0012ad2e:
          lVar13 = (long)iVar10;
          iVar10 = iVar10 + 1;
          lut._data[lVar13] = (unsigned_short)uVar12;
        }
        else {
          if (uVar11 == 0x10000) {
            for (lVar13 = (long)iVar10; lVar13 < 0x10000; lVar13 = lVar13 + 1) {
              lut._data[lVar13] = 0;
            }
            if (inPtr_local + 4 <= pcVar14) {
              Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&inPtr_local,&length);
              if (length <= inSize) {
                hufUncompress(inPtr_local,length,local_88->_tmpBuffer,
                              (int)((ulong)((long)local_70 - (long)local_88->_tmpBuffer) >> 1));
                pPVar9 = local_88;
                for (lVar13 = 0; lVar13 < pPVar9->_numChans; lVar13 = lVar13 + 1) {
                  pCVar15 = pPVar9->_channelData + lVar13;
                  lVar16 = 0;
                  for (lVar17 = 0; iVar4 = pCVar15->size, lVar17 < iVar4; lVar17 = lVar17 + 1) {
                    wav2Decode((unsigned_short *)((long)pCVar15->start + lVar16),pCVar15->nx,iVar4,
                               pCVar15->ny,pCVar15->nx * iVar4,(short)iVar10 - 1);
                    lVar16 = lVar16 + 2;
                  }
                  iVar4 = local_78;
                }
                anon_unknown_0::applyLut
                          (lut._data,pPVar9->_tmpBuffer,
                           (int)((ulong)((long)local_70 - (long)pPVar9->_tmpBuffer) >> 1));
                pcVar14 = pPVar9->_outBuffer;
                outEnd = pcVar14;
                if (pPVar9->_format == XDR) {
                  for (; pcVar14 = outEnd, iVar4 <= local_7c; iVar4 = iVar4 + 1) {
                    for (lVar13 = 0; lVar13 < pPVar9->_numChans; lVar13 = lVar13 + 1) {
                      pCVar15 = pPVar9->_channelData;
                      iVar10 = Imath_2_5::modp(iVar4,pCVar15[lVar13].ys);
                      if (iVar10 == 0) {
                        for (iVar10 = pCVar15[lVar13].size * pCVar15[lVar13].nx; 0 < iVar10;
                            iVar10 = iVar10 + -1) {
                          Xdr::write<Imf_2_5::CharPtrIO,char*>(&outEnd,*pCVar15[lVar13].end);
                          pCVar15[lVar13].end = pCVar15[lVar13].end + 1;
                        }
                      }
                      pPVar9 = local_88;
                    }
                  }
                }
                else {
                  for (; iVar4 <= local_7c; iVar4 = iVar4 + 1) {
                    lVar13 = 8;
                    for (lVar16 = 0; lVar16 < pPVar9->_numChans; lVar16 = lVar16 + 1) {
                      pCVar15 = pPVar9->_channelData;
                      iVar10 = Imath_2_5::modp(iVar4,*(int *)((long)&pCVar15->nx + lVar13));
                      if (iVar10 == 0) {
                        __n = (long)*(int *)((long)&pCVar15->ny + lVar13) *
                              (long)*(int *)((long)&pCVar15->end + lVar13) * 2;
                        memcpy(pcVar14,*(void **)((long)&pCVar15->start + lVar13),__n);
                        pcVar14 = outEnd + __n;
                        plVar1 = (long *)((long)&pCVar15->start + lVar13);
                        *plVar1 = *plVar1 + __n;
                        outEnd = pcVar14;
                      }
                      lVar13 = lVar13 + 0x20;
                      pPVar9 = local_88;
                    }
                  }
                }
                pcVar2 = pPVar9->_outBuffer;
                *local_40 = pcVar2;
                AutoArray<unsigned_short,_65536>::~AutoArray(&lut);
                AutoArray<unsigned_char,_8192>::~AutoArray(&bitmap);
                return (int)pcVar14 - (int)pcVar2;
              }
              pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::InputExc::InputExc
                        (pIVar8,"Error in header for PIZ-compressed data (invalid array length).");
              __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
            }
            pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::InputExc::InputExc(pIVar8,"PIZ compressed data too short");
            __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
          }
          if ((bitmap._data[uVar12 >> 3] >> (uVar11 & 7) & 1) != 0) goto LAB_0012ad2e;
        }
        uVar12 = (ulong)(uVar11 + 1);
      } while( true );
    }
    pcVar14 = "Error in header for PIZ-compressed data (invalid bitmap size).";
  }
  pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar8,pcVar14);
  __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

int
PizCompressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This is the cunompress function which is used by both the tiled and
    // scanline decompression routines.
    //
   
    const char* inputEnd=inPtr+inSize;

    //
    // Special case - empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }


    //
    // Determine the layout of the compressed pixel data
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    //
    // Read range compression data
    //

    unsigned short minNonZero;
    unsigned short maxNonZero;

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    memset (bitmap, 0, sizeof (unsigned char) * BITMAP_SIZE);


    if(inPtr + sizeof(unsigned short)*2 > inputEnd)
    {
   	   throw InputExc ("PIZ compressed data too short");
    }

    Xdr::read <CharPtrIO> (inPtr, minNonZero);
    Xdr::read <CharPtrIO> (inPtr, maxNonZero);

    if (maxNonZero >= BITMAP_SIZE)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid bitmap size).");
    }

    if (minNonZero <= maxNonZero)
    {
        size_t bytesToRead = maxNonZero - minNonZero + 1;
	    if(inPtr + bytesToRead > inputEnd)
        {
   	      throw InputExc ("PIZ compressed data too short");
        }

Xdr::read <CharPtrIO> (inPtr, (char *) &bitmap[0] + minNonZero,
			       bytesToRead);
    }

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = reverseLutFromBitmap (bitmap, lut);

    //
    // Huffman decoding
    //
   if(inPtr + sizeof(int)> inputEnd)
   {
       throw InputExc ("PIZ compressed data too short");
   }


    int length;
    Xdr::read <CharPtrIO> (inPtr, length);

    if (length > inSize)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid array length).");
    }

    hufUncompress (inPtr, length, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Wavelet decoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Decode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Expand the pixel data to their original range
    //

    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);
    
    //
    // Rearrange the pixel data into the format expected by the caller.
    //

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::write <CharPtrIO> (outEnd, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}